

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

LexicalScoping __thiscall
luna::SemanticAnalysisVisitor::SearchName(SemanticAnalysisVisitor *this,String *str)

{
  unordered_set<const_luna::String_*,_std::hash<const_luna::String_*>,_std::equal_to<const_luna::String_*>,_std::allocator<const_luna::String_*>_>
  *in_RDI;
  bool bVar1;
  iterator it;
  LexicalBlock *block;
  LexicalFunction *function;
  _Node_iterator_base<const_luna::String_*,_false> local_38;
  _Node_iterator_base<const_luna::String_*,_false> local_30;
  _Hash_node_base *local_28;
  _Hash_node_base *local_20;
  
  bVar1 = false;
  if ((in_RDI->_M_h)._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    bVar1 = (in_RDI->_M_h)._M_before_begin._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0;
  }
  if (bVar1) {
    local_20 = (in_RDI->_M_h)._M_before_begin._M_nxt;
    do {
      if (local_20 == (_Hash_node_base *)0x0) {
        return LexicalScoping_Global;
      }
      for (local_28 = local_20[1]._M_nxt; local_28 != (_Hash_node_base *)0x0;
          local_28 = local_28->_M_nxt) {
        local_30._M_cur =
             (__node_type *)
             std::
             unordered_set<const_luna::String_*,_std::hash<const_luna::String_*>,_std::equal_to<const_luna::String_*>,_std::allocator<const_luna::String_*>_>
             ::find(in_RDI,(key_type *)0x1ec695);
        local_38._M_cur =
             (__node_type *)
             std::
             unordered_set<const_luna::String_*,_std::hash<const_luna::String_*>,_std::equal_to<const_luna::String_*>,_std::allocator<const_luna::String_*>_>
             ::end(in_RDI);
        bVar1 = std::__detail::operator!=(&local_30,&local_38);
        if (bVar1) {
          if (local_20 != (in_RDI->_M_h)._M_before_begin._M_nxt) {
            return LexicalScoping_Upvalue;
          }
          return LexicalScoping_Local;
        }
      }
      local_20 = local_20->_M_nxt;
    } while( true );
  }
  __assert_fail("current_function_ && current_function_->current_block_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0x80,
                "LexicalScoping luna::SemanticAnalysisVisitor::SearchName(const String *) const");
}

Assistant:

LexicalScoping SearchName(const String *str) const
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_;
            while (function)
            {
                auto block = function->current_block_;
                while (block)
                {
                    auto it = block->names_.find(str);
                    if (it != block->names_.end())
                    {
                        return function == current_function_ ?
                            LexicalScoping_Local : LexicalScoping_Upvalue;
                    }

                    block = block->parent_;
                }

                function = function->parent_;
            }

            return LexicalScoping_Global;
        }